

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

node * make_simple_tree(float32 **means,float32 **vars,float32 ***mixw,int32 *nodephoneids,
                       int32 nphones,int32 ndensity,int32 nfeat,int32 ndim,int32 npermute,
                       int32 depth,int32 continuous)

{
  float fVar1;
  float fVar2;
  float32 *pfVar3;
  float32 **ppfVar4;
  float32 *pfVar5;
  float32 *pfVar6;
  float32 *pfVar7;
  float32 *pfVar8;
  float32 ***pppfVar9;
  float32 ***pppfVar10;
  int32 **ppiVar11;
  int32 **ppiVar12;
  node *pnVar13;
  int32 *piVar14;
  cmd_ln_t *cmdln;
  node *pnVar15;
  double dVar16;
  float32 cntb;
  float32 cnta;
  float32 *ovb;
  float32 *omb;
  float32 *ova;
  float32 *oma;
  float32 *nv;
  float32 *nm;
  node *root;
  int32 rnphones;
  int32 lnphones;
  int32 *rphoneids;
  int32 *lphoneids;
  int32 nsets;
  int32 set;
  int32 b;
  int32 a;
  int32 l;
  int32 k;
  int32 j;
  int32 i;
  int32 *it1d;
  int32 **it2d;
  int32 *newnumphones;
  int32 *numphones;
  int32 **newphoneid;
  int32 **phoneid;
  float32 bestdec;
  float32 minvar;
  float32 ***tmp3d;
  float32 **tmp2d;
  float32 ***newmixw;
  float32 ***oldmixw;
  float32 **newvars;
  float32 **newmeans;
  float32 **oldvars;
  float32 **oldmeans;
  int32 ndensity_local;
  int32 nphones_local;
  int32 *nodephoneids_local;
  float32 ***mixw_local;
  float32 **vars_local;
  float32 **means_local;
  
  oldvars = (float32 **)0x0;
  newmeans = (float32 **)0x0;
  newvars = (float32 **)0x0;
  oldmixw = (float32 ***)0x0;
  phoneid._4_4_ = 0.0;
  oldmeans._0_4_ = ndensity;
  oldmeans._4_4_ = nphones;
  _ndensity_local = nodephoneids;
  nodephoneids_local = (int32 *)mixw;
  mixw_local = (float32 ***)vars;
  vars_local = means;
  pnVar13 = (node *)__ckd_calloc__(1,0x30,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                   ,0x16b);
  piVar14 = (int32 *)__ckd_calloc__((long)oldmeans._4_4_,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                    ,0x16c);
  pnVar13->phoneids = piVar14;
  pnVar13->nphones = oldmeans._4_4_;
  memcpy(pnVar13->phoneids,_ndensity_local,(long)oldmeans._4_4_ << 2);
  pnVar13->depth = depth;
  newmixw = (float32 ***)
            __ckd_calloc_3d__((long)oldmeans._4_4_,(long)nfeat,(long)(int32)oldmeans,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                              ,0x172);
  tmp2d = (float32 **)
          __ckd_calloc_3d__((long)oldmeans._4_4_,(long)nfeat,(long)(int32)oldmeans,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                            ,0x173);
  newphoneid = (int32 **)
               __ckd_calloc_2d__((long)oldmeans._4_4_,(long)oldmeans._4_4_,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                 ,0x174);
  newnumphones = (int32 *)__ckd_calloc__((long)oldmeans._4_4_,4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                         ,0x175);
  numphones = (int32 *)__ckd_calloc_2d__((long)oldmeans._4_4_,(long)oldmeans._4_4_,4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                         ,0x176);
  it2d = (int32 **)
         __ckd_calloc__((long)oldmeans._4_4_,4,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                        ,0x177);
  if (continuous != 0) {
    cmdln = cmd_ln_get();
    dVar16 = cmd_ln_float_r(cmdln,"-varfloor");
    phoneid._4_4_ = (float)dVar16;
    oldvars = (float32 **)
              __ckd_calloc_2d__((long)oldmeans._4_4_,(long)ndim,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                ,0x17b);
    newmeans = (float32 **)
               __ckd_calloc_2d__((long)oldmeans._4_4_,(long)ndim,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                 ,0x17c);
    newvars = (float32 **)
              __ckd_calloc_2d__((long)oldmeans._4_4_,(long)ndim,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                ,0x17d);
    oldmixw = (float32 ***)
              __ckd_calloc_2d__((long)oldmeans._4_4_,(long)ndim,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                ,0x17e);
  }
  for (k = 0; k < oldmeans._4_4_; k = k + 1) {
    newnumphones[k] = 1;
    *newphoneid[k] = _ndensity_local[k];
    for (l = 0; l < nfeat; l = l + 1) {
      for (a = 0; a < (int32)oldmeans; a = a + 1) {
        newmixw[k][l][a] =
             *(float32 *)
              (*(long *)(*(long *)(nodephoneids_local + (long)_ndensity_local[k] * 2) + (long)l * 8)
              + (long)a * 4);
      }
    }
    if (continuous != 0) {
      for (b = 0; b < ndim; b = b + 1) {
        oldvars[k][b] = vars_local[_ndensity_local[k]][b];
        newmeans[k][b] = *(float32 *)((long)mixw_local[_ndensity_local[k]] + (long)b * 4);
      }
    }
  }
  if (npermute < oldmeans._4_4_) {
    for (lphoneids._0_4_ = oldmeans._4_4_; npermute < (int)lphoneids;
        lphoneids._0_4_ = (int)lphoneids + -1) {
      findclosestpair(oldvars,newmeans,newmixw,(int)lphoneids,(int32)oldmeans,nfeat,ndim,&set,&nsets
                      ,continuous);
      lphoneids._4_4_ = 0;
      for (k = 0; k < (int)lphoneids; k = k + 1) {
        if ((k != set) && (k != nsets)) {
          *(int32 *)((long)it2d + (long)lphoneids._4_4_ * 4) = newnumphones[k];
          for (b = 0; b < newnumphones[k]; b = b + 1) {
            *(int32 *)(*(long *)(numphones + (long)lphoneids._4_4_ * 2) + (long)b * 4) =
                 newphoneid[k][b];
          }
          for (l = 0; l < nfeat; l = l + 1) {
            for (a = 0; a < (int32)oldmeans; a = a + 1) {
              *(float32 *)(*(long *)(tmp2d[lphoneids._4_4_] + (long)l * 2) + (long)a * 4) =
                   newmixw[k][l][a];
            }
          }
          if (continuous != 0) {
            for (b = 0; b < ndim; b = b + 1) {
              newvars[lphoneids._4_4_][b] = oldvars[k][b];
              *(float32 *)((long)oldmixw[lphoneids._4_4_] + (long)b * 4) = newmeans[k][b];
            }
          }
          lphoneids._4_4_ = lphoneids._4_4_ + 1;
        }
      }
      *(int32 *)((long)it2d + (long)lphoneids._4_4_ * 4) = newnumphones[set] + newnumphones[nsets];
      for (k = 0; k < newnumphones[set]; k = k + 1) {
        *(int32 *)(*(long *)(numphones + (long)lphoneids._4_4_ * 2) + (long)k * 4) =
             newphoneid[set][k];
      }
      for (b = 0; b < newnumphones[nsets]; b = b + 1) {
        *(int32 *)(*(long *)(numphones + (long)lphoneids._4_4_ * 2) + (long)k * 4) =
             newphoneid[nsets][b];
        k = k + 1;
      }
      if (continuous == 0) {
        for (l = 0; l < nfeat; l = l + 1) {
          for (a = 0; a < (int32)oldmeans; a = a + 1) {
            *(float *)(*(long *)(tmp2d[lphoneids._4_4_] + (long)l * 2) + (long)a * 4) =
                 (float)newmixw[set][l][a] + (float)newmixw[nsets][l][a];
          }
        }
      }
      else {
        pfVar3 = newvars[lphoneids._4_4_];
        ppfVar4 = oldmixw[lphoneids._4_4_];
        pfVar5 = oldvars[set];
        pfVar6 = newmeans[set];
        pfVar7 = oldvars[nsets];
        pfVar8 = newmeans[nsets];
        fVar1 = (float)**newmixw[set];
        fVar2 = (float)**newmixw[nsets];
        **(float **)tmp2d[lphoneids._4_4_] = fVar1 + fVar2;
        for (b = 0; b < ndim; b = b + 1) {
          pfVar3[b] = (float32)((fVar1 * (float)pfVar5[b] + fVar2 * (float)pfVar7[b]) /
                               (fVar1 + fVar2));
          *(float *)((long)ppfVar4 + (long)b * 4) =
               fVar1 * ((float)pfVar5[b] * (float)pfVar5[b] + (float)pfVar6[b]) +
               fVar2 * ((float)pfVar7[b] * (float)pfVar7[b] + (float)pfVar8[b]);
          *(float *)((long)ppfVar4 + (long)b * 4) =
               -(float)pfVar3[b] * (float)pfVar3[b] +
               *(float *)((long)ppfVar4 + (long)b * 4) / (fVar1 + fVar2);
          if (*(float *)((long)ppfVar4 + (long)b * 4) < phoneid._4_4_) {
            *(float *)((long)ppfVar4 + (long)b * 4) = phoneid._4_4_;
          }
        }
      }
      ppfVar4 = newvars;
      newvars = oldvars;
      tmp3d = (float32 ***)newmeans;
      pppfVar9 = oldmixw;
      oldmixw = (float32 ***)newmeans;
      _bestdec = newmixw;
      pppfVar10 = (float32 ***)tmp2d;
      tmp2d = (float32 **)newmixw;
      it1d = (int32 *)newphoneid;
      ppiVar11 = (int32 **)numphones;
      numphones = (int32 *)newphoneid;
      _j = newnumphones;
      ppiVar12 = it2d;
      it2d = (int32 **)newnumphones;
      newnumphones = (int32 *)ppiVar12;
      newphoneid = ppiVar11;
      newmixw = pppfVar10;
      newmeans = (float32 **)pppfVar9;
      oldvars = ppfVar4;
    }
  }
  else {
    npermute = oldmeans._4_4_;
  }
  if (oldmeans._4_4_ < 2) {
    pnVar13->right = (node_str *)0x0;
    pnVar13->left = (node_str *)0x0;
  }
  else {
    phoneid._0_4_ =
         permute(vars_local,(float32 **)mixw_local,(float32 ***)nodephoneids_local,(int32)oldmeans,
                 nfeat,ndim,newphoneid,newnumphones,npermute,&rphoneids,(int32 **)&rnphones,
                 (int32 *)((long)&root + 4),(int32 *)&root,continuous);
    pnVar13->lkhd_dec = phoneid._0_4_;
    if (continuous != 0) {
      ckd_free_2d(oldvars);
      ckd_free_2d(newmeans);
      ckd_free_2d(newvars);
      ckd_free_2d(oldmixw);
    }
    ckd_free_3d(newmixw);
    ckd_free_3d(tmp2d);
    ckd_free_2d(numphones);
    ckd_free_2d(newphoneid);
    pnVar15 = make_simple_tree(vars_local,(float32 **)mixw_local,(float32 ***)nodephoneids_local,
                               rphoneids,root._4_4_,(int32)oldmeans,nfeat,ndim,npermute,
                               pnVar13->depth + 1,continuous);
    pnVar13->left = pnVar15;
    pnVar15 = make_simple_tree(vars_local,(float32 **)mixw_local,(float32 ***)nodephoneids_local,
                               _rnphones,(int32)root,(int32)oldmeans,nfeat,ndim,npermute,
                               pnVar13->depth + 1,continuous);
    pnVar13->right = pnVar15;
  }
  return pnVar13;
}

Assistant:

node *make_simple_tree (float32 **means, float32 **vars, float32 ***mixw,
           int32 *nodephoneids, int32 nphones, int32 ndensity, 
           int32 nfeat, int32 ndim, int32 npermute, int32 depth, int32 continuous)
{
    float32  **oldmeans=NULL, **oldvars=NULL, **newmeans=NULL, **newvars=NULL;
    float32  ***oldmixw, ***newmixw, **tmp2d, ***tmp3d;
    float32  minvar=0, bestdec;
    int32    **phoneid, **newphoneid, *numphones, *newnumphones, **it2d, *it1d;
    int32    i,j,k,l,a,b,set,nsets;
    int32    *lphoneids,*rphoneids,lnphones,rnphones;
    node     *root;

    /* Allocate and set basic root parameters */
    root = (node *) ckd_calloc(1,sizeof(node));
    root->phoneids = (int32 *) ckd_calloc(nphones,sizeof(int32));
    root->nphones = nphones;
    memcpy(root->phoneids,nodephoneids,nphones*sizeof(int32));
    root->depth = depth;

    /* Build the node by clustering and partitioning */
    oldmixw = (float32***)ckd_calloc_3d(nphones,nfeat,ndensity,sizeof(float32));
    newmixw = (float32***)ckd_calloc_3d(nphones,nfeat,ndensity,sizeof(float32));
    phoneid = (int32 **)ckd_calloc_2d(nphones,nphones,sizeof(int32));
    numphones = (int32 *) ckd_calloc(nphones,sizeof(int32));
    newphoneid = (int32 **)ckd_calloc_2d(nphones,nphones,sizeof(int32));
    newnumphones = (int32 *) ckd_calloc(nphones,sizeof(int32));

    if (continuous) {
        minvar = cmd_ln_float32("-varfloor");
        oldmeans = (float32 **) ckd_calloc_2d(nphones,ndim,sizeof(float32));
        oldvars = (float32 **) ckd_calloc_2d(nphones,ndim,sizeof(float32));
        newmeans = (float32 **) ckd_calloc_2d(nphones,ndim,sizeof(float32));
        newvars = (float32 **) ckd_calloc_2d(nphones,ndim,sizeof(float32));
    }

    for (i=0;i<nphones;i++){
        numphones[i] = 1;
        phoneid[i][0] =  nodephoneids[i]; /* Phone ids */
        for (j=0;j<nfeat;j++)
            for (k=0;k<ndensity;k++)
                oldmixw[i][j][k] = mixw[nodephoneids[i]][j][k];
        if (continuous) {
            for (l=0;l<ndim;l++){
                oldmeans[i][l] = means[nodephoneids[i]][l];
                oldvars[i][l] = vars[nodephoneids[i]][l];
            }
        }
    }
    if (nphones > npermute){

        for (nsets = nphones; nsets > npermute; nsets--) {
            /* Find the closest distributions */
            findclosestpair(oldmeans,oldvars,oldmixw,nsets,ndensity,
                                                         nfeat,ndim,&a,&b, continuous);

            /* Copy and Merge distributions... */
            /* Copy unmerged distributions first */
            for (i=0,set=0;i<nsets;i++){
                if (i != a && i != b){
                    newnumphones[set] = numphones[i];
                    for (l=0;l<numphones[i];l++)
                        newphoneid[set][l] = phoneid[i][l];
                    for (j=0;j<nfeat;j++)
                        for (k=0;k<ndensity;k++)
                            newmixw[set][j][k] = oldmixw[i][j][k];
                    if (continuous) {
                        for (l=0;l<ndim;l++){
                            newmeans[set][l] = oldmeans[i][l];
                            newvars[set][l] = oldvars[i][l];
                        }
                    }
                    set++;
                }
            }
            /* Merge a and b */
            newnumphones[set] =  numphones[a]+numphones[b];
            for (i=0;i<numphones[a];i++)
                newphoneid[set][i] = phoneid[a][i];
            for (l=0;l<numphones[b];l++,i++)
                newphoneid[set][i] = phoneid[b][l];
            if (continuous) {
                float32 *nm = newmeans[set];
                float32 *nv = newvars[set];
                float32 *oma = oldmeans[a];
                float32 *ova = oldvars[a];
                float32 *omb = oldmeans[b];
                float32 *ovb = oldvars[b];
                float32 cnta, cntb;

                cnta = oldmixw[a][0][0]; cntb = oldmixw[b][0][0];
                newmixw[set][0][0] = cnta + cntb;
                for (l=0;l<ndim;l++){
                    nm[l] = (cnta*oma[l] + cntb*omb[l]) / (cnta + cntb);
                    nv[l] = cnta*(ova[l]+oma[l]*oma[l]) +
                            cntb*(ovb[l]+omb[l]*omb[l]);
                    nv[l] = nv[l]/(cnta+cntb) - nm[l]*nm[l];
                    if (nv[l] < minvar) nv[l] = minvar;
                }
            }
            else {
                for (j=0;j<nfeat;j++)
                    for (k=0;k<ndensity;k++)
                        newmixw[set][j][k] = oldmixw[a][j][k]+oldmixw[b][j][k];
            }

            /* Switch old and new variables */
            tmp2d = oldmeans; oldmeans = newmeans; newmeans = tmp2d;
            tmp2d = oldvars;  oldvars = newvars;   newvars = tmp2d;
            tmp3d = oldmixw;  oldmixw = newmixw;   newmixw = tmp3d;
            it2d = phoneid;  phoneid = newphoneid; newphoneid = it2d;
            it1d = numphones; numphones = newnumphones; newnumphones = it1d;
        }
    }
    else npermute = nphones;

    if (nphones < 2){
        root->left = root->right = NULL; /* Dont split further */
        return(root);
    }

    bestdec = permute(means,vars,mixw,ndensity,nfeat,ndim,phoneid,numphones,
                      npermute,&lphoneids,&rphoneids,&lnphones,&rnphones, continuous);

    root->lkhd_dec = bestdec;

    if (continuous) {
        ckd_free_2d((void **)oldmeans); ckd_free_2d((void **)oldvars);
        ckd_free_2d((void **)newmeans); ckd_free_2d((void **)newvars);
    }
    ckd_free_3d((void ***)oldmixw); ckd_free_3d((void ***)newmixw);
    ckd_free_2d((void **)newphoneid); ckd_free_2d((void **)phoneid);

    /* Recurse */
    root->left = make_simple_tree(means,vars,mixw,lphoneids,lnphones,
              ndensity,nfeat,ndim,npermute,root->depth+1, continuous);
    root->right = make_simple_tree(means,vars,mixw,rphoneids,rnphones,
              ndensity,nfeat,ndim,npermute,root->depth+1, continuous);

    return(root);
}